

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-chunk.c
# Opt level: O0

chunk_conflict * chunk_find_adjacent(wchar_t place,char *direction)

{
  level_conflict *plVar1;
  int iVar2;
  level *lev;
  char *direction_local;
  chunk_conflict *pcStack_10;
  wchar_t place_local;
  
  plVar1 = world->levels;
  iVar2 = strcmp(direction,"north");
  if (iVar2 == 0) {
    pcStack_10 = chunk_find_name(plVar1[place].north);
  }
  else {
    iVar2 = strcmp(direction,"east");
    if (iVar2 == 0) {
      pcStack_10 = chunk_find_name(plVar1[place].east);
    }
    else {
      iVar2 = strcmp(direction,"south");
      if (iVar2 == 0) {
        pcStack_10 = chunk_find_name(plVar1[place].south);
      }
      else {
        iVar2 = strcmp(direction,"west");
        if (iVar2 == 0) {
          pcStack_10 = chunk_find_name(plVar1[place].west);
        }
        else {
          iVar2 = strcmp(direction,"up");
          if (iVar2 == 0) {
            pcStack_10 = chunk_find_name(plVar1[place].up);
          }
          else {
            iVar2 = strcmp(direction,"down");
            if (iVar2 == 0) {
              pcStack_10 = chunk_find_name(plVar1[place].down);
            }
            else {
              pcStack_10 = (chunk_conflict *)0x0;
            }
          }
        }
      }
    }
  }
  return pcStack_10;
}

Assistant:

struct chunk *chunk_find_adjacent(int place, const char *direction)
{
	struct level *lev = &world->levels[place];

	if (streq(direction, "north")) {
		return chunk_find_name(lev->north);
	} else if (streq(direction, "east")) {
		return chunk_find_name(lev->east);
	} else if (streq(direction, "south")) {
		return chunk_find_name(lev->south);
	} else if (streq(direction, "west")) {
		return chunk_find_name(lev->west);
	} else if (streq(direction, "up")) {
		return chunk_find_name(lev->up);
	} else if (streq(direction, "down")) {
		return chunk_find_name(lev->down);
	}

	return NULL;
}